

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsSS.cpp
# Opt level: O3

bool __thiscall
helics::zeromq::ZmqCommsSS::processTxControlCmd
          (ZmqCommsSS *this,ActionMessage *cmd,
          map<helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *routes,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *connection_info)

{
  _Base_ptr __n;
  byte *__s1;
  int iVar1;
  _Rb_tree_node_base *p_Var2;
  bool bVar3;
  size_type __rlen;
  _Rb_tree_header *p_Var4;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar5;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  iVar1 = cmd->messageID;
  bVar3 = false;
  if (iVar1 < 0x7cd) {
    if (iVar1 == 0xe9) {
      p_Var2 = (_Rb_tree_node_base *)
               (connection_info->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var4 = &(connection_info->_M_t)._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var2 != p_Var4) {
        __n = (_Base_ptr)(cmd->payload).bufferSize;
        __s1 = (cmd->payload).heap;
        do {
          if (__n == p_Var2[2]._M_parent) {
            if (__n != (_Base_ptr)0x0) {
              iVar1 = bcmp(__s1,*(void **)(p_Var2 + 2),(size_t)__n);
              if (iVar1 != 0) goto LAB_002c0838;
            }
            local_50._M_len = CONCAT44(local_50._M_len._4_4_,(cmd->dest_handle).hid);
            std::
            _Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::__cxx11::string>,std::_Select1st<std::pair<helics::route_id_const,std::__cxx11::string>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::__cxx11::string>>>
            ::_M_emplace_unique<helics::route_id,std::__cxx11::string_const&>
                      ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::__cxx11::string>,std::_Select1st<std::pair<helics::route_id_const,std::__cxx11::string>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::__cxx11::string>>>
                        *)routes,(route_id *)&local_50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var2 + 1));
            break;
          }
LAB_002c0838:
          p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
        } while ((_Rb_tree_header *)p_Var2 != p_Var4);
      }
    }
    else if (iVar1 == 0xf4) {
      local_50._M_len = CONCAT44(local_50._M_len._4_4_,(cmd->dest_handle).hid);
      pVar5 = std::
              _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::equal_range(&routes->_M_t,(key_type *)&local_50);
      std::
      _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_erase_aux(&routes->_M_t,(_Base_ptr)pVar5.first._M_node,(_Base_ptr)pVar5.second._M_node);
    }
    else {
      if (iVar1 != 299) {
        return false;
      }
      if ((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == true) {
        local_50._M_len = (cmd->payload).bufferSize;
        local_50._M_str = (char *)(cmd->payload).heap;
        local_40._M_len = local_50._M_len;
        local_40._M_str = local_50._M_str;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::
        _M_emplace_unique<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)connection_info,&local_50,&local_40);
      }
    }
    bVar3 = false;
  }
  else if ((iVar1 == 0x16570bf) || (iVar1 == 0x9db)) {
    bVar3 = true;
  }
  else if (iVar1 == 0x7cd) {
    bVar3 = false;
    CommsInterface::setTxStatus((CommsInterface *)this,CONNECTED);
  }
  return bVar3;
}

Assistant:

bool ZmqCommsSS::processTxControlCmd(const ActionMessage& cmd,
                                     std::map<route_id, std::string>& routes,
                                     std::map<std::string, std::string>& connection_info)
{
    bool close_tx{false};

    switch (cmd.messageID) {
        case RECONNECT_TRANSMITTER:
            setTxStatus(ConnectionStatus::CONNECTED);
            break;
        case CONNECTION_INFORMATION:
            // Shouldn't reach here ideally
            if (serverMode) {
                connection_info.emplace(cmd.name(), cmd.payload.to_string());
            }
            break;
        case NEW_ROUTE:
            for (auto& mc : connection_info) {
                if (mc.second == cmd.payload.to_string()) {
                    routes.emplace(route_id(cmd.getExtraData()), mc.first);
                    break;
                }
            }
            break;
        case REMOVE_ROUTE:
            routes.erase(route_id(cmd.getExtraData()));
            break;
        case CLOSE_RECEIVER:
        case DISCONNECT:
            close_tx = true;
            break;
    }
    return close_tx;
}